

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O1

void __thiscall
Imath_3_2::FrustumTest<float>::setFrustum
          (FrustumTest<float> *this,Frustum<float> *frustum,Matrix44<float> *cameraMat)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  Plane3<float> frustumPlanes [6];
  Plane3<float> local_78;
  uint auStack_68 [20];
  
  Frustum<float>::planes(frustum,&local_78,cameraMat);
  lVar12 = 0;
  do {
    fVar1 = (&local_78.normal.x)[lVar12];
    uVar2 = auStack_68[lVar12];
    uVar3 = auStack_68[lVar12 + 4];
    *(float *)((long)&this->planeNormX[0].x + lVar12) = fVar1;
    *(uint *)((long)&this->planeNormX[0].y + lVar12) = uVar2;
    *(uint *)((long)&this->planeNormX[0].z + lVar12) = uVar3;
    uVar4 = auStack_68[lVar12 + -3];
    uVar5 = auStack_68[lVar12 + 1];
    uVar6 = auStack_68[lVar12 + 5];
    *(uint *)((long)&this->planeNormY[0].x + lVar12) = uVar4;
    *(uint *)((long)&this->planeNormY[0].y + lVar12) = uVar5;
    *(uint *)((long)&this->planeNormY[0].z + lVar12) = uVar6;
    uVar7 = auStack_68[lVar12 + -2];
    uVar8 = auStack_68[lVar12 + 2];
    uVar9 = auStack_68[lVar12 + 6];
    *(uint *)((long)&this->planeNormZ[0].x + lVar12) = uVar7;
    *(uint *)((long)&this->planeNormZ[0].y + lVar12) = uVar8;
    *(uint *)((long)&this->planeNormZ[0].z + lVar12) = uVar9;
    *(ulong *)((long)&this->planeNormAbsX[0].x + lVar12) =
         CONCAT44(uVar2,fVar1) & 0x7fffffff7fffffff;
    *(uint *)((long)&this->planeNormAbsX[0].z + lVar12) = uVar3 & 0x7fffffff;
    *(ulong *)((long)&this->planeNormAbsY[0].x + lVar12) =
         CONCAT44(uVar5,uVar4) & 0x7fffffff7fffffff;
    *(uint *)((long)&this->planeNormAbsY[0].z + lVar12) = uVar6 & 0x7fffffff;
    *(ulong *)((long)&this->planeNormAbsZ[0].x + lVar12) =
         CONCAT44(uVar8,uVar7) & 0x7fffffff7fffffff;
    *(uint *)((long)&this->planeNormAbsZ[0].z + lVar12) = uVar9 & 0x7fffffff;
    uVar2 = auStack_68[lVar12 + 3];
    uVar3 = auStack_68[lVar12 + 7];
    *(uint *)((long)&this->planeOffsetVec[0].x + lVar12) = auStack_68[lVar12 + -1];
    *(uint *)((long)&this->planeOffsetVec[0].y + lVar12) = uVar2;
    *(uint *)((long)&this->planeOffsetVec[0].z + lVar12) = uVar3;
    lVar12 = lVar12 + 0xc;
  } while (lVar12 == 0xc);
  fVar1 = frustum->_farPlane;
  fVar10 = frustum->_left;
  fVar11 = frustum->_right;
  (this->currFrustum)._nearPlane = frustum->_nearPlane;
  (this->currFrustum)._farPlane = fVar1;
  (this->currFrustum)._left = fVar10;
  (this->currFrustum)._right = fVar11;
  fVar1 = frustum->_bottom;
  (this->currFrustum)._top = frustum->_top;
  (this->currFrustum)._bottom = fVar1;
  (this->currFrustum)._orthographic = frustum->_orthographic;
  (this->cameraMatrix).x[0][0] = cameraMat->x[0][0];
  (this->cameraMatrix).x[0][1] = cameraMat->x[0][1];
  (this->cameraMatrix).x[0][2] = cameraMat->x[0][2];
  (this->cameraMatrix).x[0][3] = cameraMat->x[0][3];
  (this->cameraMatrix).x[1][0] = cameraMat->x[1][0];
  (this->cameraMatrix).x[1][1] = cameraMat->x[1][1];
  (this->cameraMatrix).x[1][2] = cameraMat->x[1][2];
  (this->cameraMatrix).x[1][3] = cameraMat->x[1][3];
  (this->cameraMatrix).x[2][0] = cameraMat->x[2][0];
  (this->cameraMatrix).x[2][1] = cameraMat->x[2][1];
  (this->cameraMatrix).x[2][2] = cameraMat->x[2][2];
  (this->cameraMatrix).x[2][3] = cameraMat->x[2][3];
  (this->cameraMatrix).x[3][0] = cameraMat->x[3][0];
  (this->cameraMatrix).x[3][1] = cameraMat->x[3][1];
  (this->cameraMatrix).x[3][2] = cameraMat->x[3][2];
  (this->cameraMatrix).x[3][3] = cameraMat->x[3][3];
  return;
}

Assistant:

void
FrustumTest<T>::setFrustum (
    const Frustum<T>& frustum, const Matrix44<T>& cameraMat) IMATH_NOEXCEPT
{
    Plane3<T> frustumPlanes[6];
    frustum.planes (frustumPlanes, cameraMat);

    // Here's where we effectively transpose the plane equations.
    // We stuff all six X's into the two planeNormX vectors, etc.
    for (int i = 0; i < 2; ++i)
    {
        int index = i * 3;

        planeNormX[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.x,
            frustumPlanes[index + 1].normal.x,
            frustumPlanes[index + 2].normal.x);
        planeNormY[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.y,
            frustumPlanes[index + 1].normal.y,
            frustumPlanes[index + 2].normal.y);
        planeNormZ[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.z,
            frustumPlanes[index + 1].normal.z,
            frustumPlanes[index + 2].normal.z);

        planeNormAbsX[i] = Vec3<T> (
            std::abs (planeNormX[i].x),
            std::abs (planeNormX[i].y),
            std::abs (planeNormX[i].z));
        planeNormAbsY[i] = Vec3<T> (
            std::abs (planeNormY[i].x),
            std::abs (planeNormY[i].y),
            std::abs (planeNormY[i].z));
        planeNormAbsZ[i] = Vec3<T> (
            std::abs (planeNormZ[i].x),
            std::abs (planeNormZ[i].y),
            std::abs (planeNormZ[i].z));

        planeOffsetVec[i] = Vec3<T> (
            frustumPlanes[index + 0].distance,
            frustumPlanes[index + 1].distance,
            frustumPlanes[index + 2].distance);
    }
    currFrustum  = frustum;
    cameraMatrix = cameraMat;
}